

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::BasicBufferDataCase::iterate(BasicBufferDataCase *this)

{
  CallLogWrapper *this_00;
  deUint32 dVar1;
  int iVar2;
  char *description;
  size_t in_R9;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  BufferVerifier local_40;
  ReferenceBuffer local_38;
  
  dVar1 = deStringHash((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_name.
                       _M_dataplus._M_p);
  BufferTestUtil::BufferVerifier::BufferVerifier
            (&local_40,(this->super_BufferCase).super_TestCase.m_context,this->m_verify);
  local_38.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (deUint8 *)0x0;
  local_38.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BufferTestUtil::ReferenceBuffer::setSize(&local_38,this->m_size);
  BufferTestUtil::fillWithRandomBytes
            (local_38.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,this->m_size,dVar1 ^ 0x125);
  dVar1 = BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_target,dVar1);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_target,(long)this->m_size,
             local_38.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,this->m_usage);
  BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
  iVar2 = BufferTestUtil::BufferVerifier::verify
                    (&local_40,(EVP_PKEY_CTX *)(ulong)dVar1,
                     local_38.m_data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,0,(uchar *)(ulong)(uint)this->m_size,in_R9);
  BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,dVar1);
  description = "Buffer verification failed";
  if ((byte)iVar2 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (uint)(byte)((byte)iVar2 ^ 1),description);
  if (local_38.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_38.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BufferTestUtil::BufferVerifier::~BufferVerifier(&local_40);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			dataSeed	= deStringHash(getName()) ^ 0x125;
		BufferVerifier			verifier	(m_context, m_verify);
		ReferenceBuffer			refBuf;
		bool					isOk		= false;

		refBuf.setSize(m_size);
		fillWithRandomBytes(refBuf.getPtr(), m_size, dataSeed);

		deUint32 buf = genBuffer();
		glBindBuffer(m_target, buf);
		glBufferData(m_target, m_size, refBuf.getPtr(), m_usage);

		checkError();

		isOk = verifier.verify(buf, refBuf.getPtr(), 0, m_size);

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}